

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O0

int GetUBXPacketublox(UBLOX *publox,UBXDATA *pUBXData)

{
  int iVar1;
  double dVar2;
  int local_10a4;
  undefined1 local_10a0 [8];
  CHRONO chrono;
  int local_1050;
  int mid;
  int mclass;
  int packetlen;
  uchar *ptr;
  int local_1038;
  int nbBytesDiscarded;
  int nbBytesToRequest;
  int res;
  int recvbuflen;
  int BytesReceived;
  uchar recvbuf [4096];
  UBXDATA *pUBXData_local;
  UBLOX *publox_local;
  
  res = 0;
  nbBytesToRequest = 0;
  nbBytesDiscarded = 1;
  local_1038 = 0;
  ptr._4_4_ = 0;
  _mclass = (uchar *)0x0;
  mid = 0;
  local_1050 = 0;
  chrono._68_4_ = 0;
  StartChrono((CHRONO *)local_10a0);
  memset(&recvbuflen,0,0x1000);
  nbBytesToRequest = 0xfff;
  res = 0;
  local_1038 = 8;
  iVar1 = ReadAllRS232Port(&publox->RS232Port,(uint8 *)&recvbuflen,8);
  if (iVar1 == 0) {
    if ((publox->bSaveRawData != 0) && (publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(&recvbuflen,(long)local_1038,1,(FILE *)publox->pfSaveFile);
      fflush((FILE *)publox->pfSaveFile);
    }
    res = local_1038 + res;
    do {
      nbBytesDiscarded =
           FindPacketUBX((uchar *)&recvbuflen,res,&local_1050,(int *)&chrono.field_0x44,&mid,
                         &local_1038,(uchar **)&mclass,(int *)((long)&ptr + 4));
      if (nbBytesDiscarded == 0) {
        if (0 < (res - ptr._4_4_) - mid) {
          printf("Warning getting data from a ublox : Unexpected data after a packet. \n");
        }
        iVar1 = ProcessPacketUBX(_mclass,mid,local_1050,chrono._68_4_,pUBXData);
        if (iVar1 != 0) {
          return 1;
        }
        return 0;
      }
      if (nbBytesDiscarded == 1) {
        if (ptr._4_4_ < 9) {
          local_10a4 = ptr._4_4_;
        }
        else {
          local_10a4 = 8;
        }
        local_1038 = local_10a4;
      }
      memmove(&recvbuflen,(void *)((long)&recvbuflen + (long)ptr._4_4_),(long)(res - ptr._4_4_));
      res = res - ptr._4_4_;
      if (nbBytesToRequest < res + local_1038) {
        printf("Error reading data from a ublox : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadAllRS232Port(&publox->RS232Port,(uint8 *)((long)&recvbuflen + (long)res),
                               local_1038);
      if (iVar1 != 0) {
        printf("Error reading data from a ublox. \n");
        return 1;
      }
      if ((publox->bSaveRawData != 0) && (publox->pfSaveFile != (FILE *)0x0)) {
        fwrite((void *)((long)&recvbuflen + (long)res),(long)local_1038,1,(FILE *)publox->pfSaveFile
              );
        fflush((FILE *)publox->pfSaveFile);
      }
      res = local_1038 + res;
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_10a0);
    } while (dVar2 <= 4.0);
    printf("Error reading data from a ublox : Packet timeout. \n");
    publox_local._4_4_ = 2;
  }
  else {
    printf("Error reading data from a ublox. \n");
    publox_local._4_4_ = 1;
  }
  return publox_local._4_4_;
}

Assistant:

inline int GetUBXPacketublox(UBLOX* publox, UBXDATA* pUBXData)
{
	unsigned char recvbuf[MAX_NB_BYTES_UBLOX];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	int packetlen = 0;
	int mclass = 0, mid = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_UBLOX-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_PACKET_LENGTH_UBX;
	if (ReadAllRS232Port(&publox->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(recvbuf, nbBytesToRequest, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindPacketUBX(recvbuf, BytesReceived, &mclass, &mid, &packetlen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_PACKET_LENGTH_UBX, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a ublox : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&publox->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a ublox. \n");
			return EXIT_FAILURE;
		}
		if ((publox->bSaveRawData)&&(publox->pfSaveFile))
		{
			fwrite(recvbuf+BytesReceived, nbBytesToRequest, 1, publox->pfSaveFile);
			fflush(publox->pfSaveFile);
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_UBLOX)
		{
			printf("Error reading data from a ublox : Packet timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-packetlen > 0)
	{
		printf("Warning getting data from a ublox : Unexpected data after a packet. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *ppacketlen)
	//{
	//	printf("Error getting data from a ublox : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*ppacketlen > 0)
	//{
	//	memcpy(databuf, ptr, *ppacketlen);
	//}

	if (ProcessPacketUBX(ptr, packetlen, mclass, mid, pUBXData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}